

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1;
  ForeachLoopListSyntax *args_3;
  StatementSyntax *args_4;
  ForeachLoopStatementSyntax *pFVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_49;
  Token local_48;
  NamedLabelSyntax *local_38;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_38 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_38 = (NamedLabelSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_48,
                          (BumpAllocator *)__child_stack);
  }
  args_1 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  args_3 = (ForeachLoopListSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x68),&local_49,(BumpAllocator *)__child_stack);
  args_4 = (StatementSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x70),&local_49,(BumpAllocator *)__child_stack);
  pFVar1 = BumpAllocator::
           emplace<slang::syntax::ForeachLoopStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ForeachLoopListSyntax&,slang::syntax::StatementSyntax&>
                     ((BumpAllocator *)__child_stack,&local_38,args_1,&local_48,args_3,args_4);
  return (int)pFVar1;
}

Assistant:

static SyntaxNode* clone(const ForeachLoopStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ForeachLoopStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        *deepClone<ForeachLoopListSyntax>(*node.loopList, alloc),
        *deepClone<StatementSyntax>(*node.statement, alloc)
    );
}